

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void forget_objects(int percent)

{
  uint uVar1;
  long lVar2;
  int oindx;
  ulong uVar3;
  int count;
  long lVar4;
  ulong uVar5;
  int indices [538];
  uint local_898 [538];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_objects: bad percent %d",percent);
      return;
    }
    count = 0;
    uVar1 = 1;
    lVar2 = 0x38;
    do {
      if ((obj_descr[*(short *)((long)objects + lVar2 + -0xe)].oc_descr != (char *)0x0) &&
         (((*(byte *)((long)&objects->oc_name_idx + lVar2) & 1) != 0 ||
          (*(long *)((long)objects + lVar2 + -8) != 0)))) {
        lVar4 = (long)count;
        count = count + 1;
        local_898[lVar4] = uVar1;
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar2 != 0x5420);
    randomize((int *)local_898,count);
    if (0x31 < percent * count) {
      uVar5 = 0;
      do {
        uVar3 = (ulong)local_898[uVar5];
        do {
          oindx = (int)uVar3;
          objects[oindx].field_0x10 = objects[oindx].field_0x10 & 0xfe;
          objects[oindx].field_0x10 = objects[oindx].field_0x10 & 0xf7;
          if (objects[oindx].oc_uname != (char *)0x0) {
            free(objects[oindx].oc_uname);
            objects[oindx].oc_uname = (char *)0x0;
          }
          undiscover_object(oindx);
          if (oindx - 0x5fU < 0xb) {
            uVar1 = oindx - 0xb;
          }
          else {
            if (10 < oindx - 0x54U) break;
            uVar1 = oindx + 0xb;
          }
          uVar3 = (ulong)uVar1;
        } while ((objects[uVar3].field_0x10 & 1) != 0);
        uVar5 = uVar5 + 1;
      } while (uVar5 != (ulong)(percent * count + 0x32) / 100);
    }
  }
  return;
}

Assistant:

void forget_objects(int percent)
{
	int i, count;
	int indices[NUM_OBJECTS];

	if (percent == 0) return;
	if (percent <= 0 || percent > 100) {
	    impossible("forget_objects: bad percent %d", percent);
	    return;
	}

	for (count = 0, i = 1; i < NUM_OBJECTS; i++)
	    if (OBJ_DESCR(objects[i]) &&
		    (objects[i].oc_name_known || objects[i].oc_uname))
		indices[count++] = i;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++)
	    forget_single_object(indices[i]);
}